

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpc_to_refl_coef.c
# Opt level: O2

void WebRtcSpl_LpcToReflCoef(int16_t *a16,int use_order,int16_t *k16)

{
  short sVar1;
  int32_t iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int32_t tmp32 [50];
  
  lVar7 = (long)use_order;
  k16[lVar7 + -1] = a16[lVar7] << 3;
  uVar5 = (ulong)(uint)use_order;
  lVar8 = lVar7;
  while (uVar4 = 1, lVar7 = lVar7 + -1, 1 < lVar8) {
    lVar9 = lVar8 + -1;
    sVar1 = k16[lVar9];
    lVar6 = lVar7;
    for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      iVar2 = WebRtcSpl_DivW32W16((uint)(ushort)a16[uVar4] * 0x10000 +
                                  (int)a16[lVar6] * (int)k16[lVar9] * -2,
                                  (int16_t)(0x3fffffffU - (int)sVar1 * (int)sVar1 >> 0xf));
      tmp32[uVar4] = iVar2;
      lVar6 = lVar6 + -1;
    }
    for (lVar6 = 1; lVar6 < lVar9; lVar6 = lVar6 + 1) {
      a16[lVar6] = (int16_t)((uint)tmp32[lVar6] >> 1);
    }
    iVar3 = tmp32[lVar9];
    if (iVar3 < -0x1ffe) {
      iVar3 = -0x1fff;
    }
    if (0x1ffe < iVar3) {
      iVar3 = 0x1fff;
    }
    tmp32[lVar9] = iVar3;
    k16[lVar8 + -2] = (int16_t)(iVar3 << 2);
    uVar5 = uVar5 - 1;
    lVar8 = lVar9;
  }
  return;
}

Assistant:

void WebRtcSpl_LpcToReflCoef(int16_t* a16, int use_order, int16_t* k16)
{
    int m, k;
    int32_t tmp32[SPL_LPC_TO_REFL_COEF_MAX_AR_MODEL_ORDER];
    int32_t tmp_inv_denom32;
    int16_t tmp_inv_denom16;

    k16[use_order - 1] = a16[use_order] << 3;  // Q12<<3 => Q15
    for (m = use_order - 1; m > 0; m--)
    {
        // (1 - k^2) in Q30
        tmp_inv_denom32 = 1073741823 - k16[m] * k16[m];
        // (1 - k^2) in Q15
        tmp_inv_denom16 = (int16_t)(tmp_inv_denom32 >> 15);

        for (k = 1; k <= m; k++)
        {
            // tmp[k] = (a[k] - RC[m] * a[m-k+1]) / (1.0 - RC[m]*RC[m]);

            // [Q12<<16 - (Q15*Q12)<<1] = [Q28 - Q28] = Q28
            tmp32[k] = (a16[k] << 16) - (k16[m] * a16[m - k + 1] << 1);

            tmp32[k] = WebRtcSpl_DivW32W16(tmp32[k], tmp_inv_denom16); //Q28/Q15 = Q13
        }

        for (k = 1; k < m; k++)
        {
            a16[k] = (int16_t)(tmp32[k] >> 1);  // Q13>>1 => Q12
        }

        tmp32[m] = WEBRTC_SPL_SAT(8191, tmp32[m], -8191);
        k16[m - 1] = (int16_t)WEBRTC_SPL_LSHIFT_W32(tmp32[m], 2); //Q13<<2 => Q15
    }
    return;
}